

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.hpp
# Opt level: O0

void __thiscall vkt::sr::ShaderEvalContext::ShaderSampler::ShaderSampler(ShaderSampler *this)

{
  ShaderSampler *this_local;
  
  tcu::Sampler::Sampler(&this->sampler);
  this->tex1D = (Texture1D *)0x0;
  this->tex2D = (Texture2D *)0x0;
  this->tex3D = (Texture3D *)0x0;
  this->texCube = (TextureCube *)0x0;
  this->tex1DArray = (Texture1DArray *)0x0;
  this->tex2DArray = (Texture2DArray *)0x0;
  this->texCubeArray = (TextureCubeArray *)0x0;
  return;
}

Assistant:

inline ShaderSampler (void)
			: tex1D			(DE_NULL)
			, tex2D			(DE_NULL)
			, tex3D			(DE_NULL)
			, texCube		(DE_NULL)
			, tex1DArray	(DE_NULL)
			, tex2DArray	(DE_NULL)
			, texCubeArray	(DE_NULL)
		{
		}